

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmp_diff.hpp
# Opt level: O3

Diffs * __thiscall
MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
diff_bisectSplit(Diffs *__return_storage_ptr__,
                MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *this,Range text1,Range text2,int x,int y,Time deadline)

{
  ConstIter CVar1;
  ConstIter CVar2;
  ConstIter CVar3;
  ConstIter CVar4;
  ulong end;
  ulong end_00;
  Range RVar5;
  Range RVar6;
  Diffs diffsb;
  Diffs local_68;
  Range local_50;
  Range local_40;
  
  local_50.till = text2.till._M_current;
  local_50.from = text2.from._M_current;
  local_40.till = text1.till._M_current;
  local_40.from = text1.from._M_current;
  end_00 = (ulong)y;
  end = (ulong)x;
  RVar5 = Range::substr(&local_40,0,end);
  RVar6 = Range::substr(&local_50,0,end_00);
  CVar2._M_current = local_40.till._M_current;
  CVar1._M_current = local_50.till._M_current;
  if (end <= (ulong)((long)local_40.till._M_current - (long)local_40.from._M_current)) {
    if (end_00 <= (ulong)((long)local_50.till._M_current - (long)local_50.from._M_current)) {
      CVar4._M_current = local_40.from._M_current + end;
      CVar3._M_current = local_50.from._M_current + end_00;
      diff_main(__return_storage_ptr__,this,RVar5,RVar6,deadline);
      RVar5.till._M_current = CVar2._M_current;
      RVar5.from._M_current = CVar4._M_current;
      RVar6.till._M_current = CVar1._M_current;
      RVar6.from._M_current = CVar3._M_current;
      diff_main(&local_68,this,RVar5,RVar6,deadline);
      std::
      vector<MyersDiff<std::__cxx11::string>::Diff,std::allocator<MyersDiff<std::__cxx11::string>::Diff>>
      ::
      _M_range_insert<__gnu_cxx::__normal_iterator<MyersDiff<std::__cxx11::string>::Diff*,std::vector<MyersDiff<std::__cxx11::string>::Diff,std::allocator<MyersDiff<std::__cxx11::string>::Diff>>>>
                ((vector<MyersDiff<std::__cxx11::string>::Diff,std::allocator<MyersDiff<std::__cxx11::string>::Diff>>
                  *)__return_storage_ptr__,
                 (__return_storage_ptr__->
                 super__Vector_base<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff,_std::allocator<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff>_>
                 )._M_impl.super__Vector_impl_data._M_finish,
                 local_68.
                 super__Vector_base<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff,_std::allocator<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 local_68.
                 super__Vector_base<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff,_std::allocator<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      if (local_68.
          super__Vector_base<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff,_std::allocator<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68.
                        super__Vector_base<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff,_std::allocator<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      return __return_storage_ptr__;
    }
  }
  __assert_fail("start <= size()",
                "/workspace/llm4binary/github/license_c_cmakelists/gritzko[P]myers-diff/dmp_diff.hpp"
                ,0x6c,
                "Range MyersDiff<std::basic_string<char>>::Range::substr(Size) const [String = std::basic_string<char>]"
               );
}

Assistant:

Diffs diff_bisectSplit(Range text1, Range text2, int x, int y,
                           Time deadline) {
        Range text1a = text1.substr(0, x);
        Range text2a = text2.substr(0, y);
        Range text1b = text1.substr(x);
        Range text2b = text2.substr(y);

        // Compute both diffs serially.
        Diffs diffs = diff_main(text1a, text2a, deadline);
        Diffs diffsb = diff_main(text1b, text2b, deadline);

        diffs.insert(diffs.end(), diffsb.begin(), diffsb.end());
        return diffs;
    }